

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plain_bonsai_nlm.hpp
# Opt level: O2

value_type_conflict7 * __thiscall
poplar::plain_bonsai_nlm<int>::insert(plain_bonsai_nlm<int> *this,uint64_t pos,char_range *key)

{
  ulong __n;
  uint8_t *puVar1;
  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true> dst;
  pointer __p_00;
  pointer __p;
  uint64_t num;
  __uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> local_38;
  
  this->size_ = this->size_ + 1;
  num = (long)key->end - (long)key->begin;
  __n = num + 4;
  __p_00 = (pointer)operator_new__(__n);
  memset(__p_00,0,__n);
  local_38._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
       (_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>)0x0;
  std::__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>::reset
            ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> *)
             ((this->ptrs_).
              super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + pos),__p_00);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_38);
  dst.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (this->ptrs_).
       super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[pos]._M_t.
       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>;
  copy_bytes((uint8_t *)
             dst.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,key->begin,num);
  this->label_bytes_ = this->label_bytes_ + __n;
  puVar1 = (uint8_t *)
           ((long)dst.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + num);
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  return (value_type_conflict7 *)
         ((long)dst.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
                .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + num);
}

Assistant:

value_type* insert(uint64_t pos, const char_range& key) {
        assert(!ptrs_[pos]);

        ++size_;

        uint64_t length = key.length();
        ptrs_[pos] = std::make_unique<uint8_t[]>(length + sizeof(value_type));
        auto ptr = ptrs_[pos].get();
        copy_bytes(ptr, key.begin, length);

        label_bytes_ += length + sizeof(value_type);

#ifdef POPLAR_EXTRA_STATS
        max_length_ = std::max(max_length_, length);
        sum_length_ += length;
#endif

        auto ret = reinterpret_cast<value_type*>(ptr + length);
        *ret = static_cast<value_type>(0);

        return ret;
    }